

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O1

bool EV_Teleport(int tid,int tag,line_t *line,int side,AActor *thing,int flags)

{
  double dVar1;
  APlayerPawn *pAVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  PClass *pPVar8;
  undefined4 extraout_var;
  PClass *pPVar9;
  byte bVar10;
  ulong uVar11;
  int iVar12;
  AActor *unaff_R14;
  double dVar13;
  ulong extraout_XMM0_Qb;
  double dVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  NActorIterator iterator;
  NActorIterator it2;
  double local_b8;
  double local_b0;
  undefined1 local_98 [28];
  FName local_7c;
  double local_78;
  ulong uStack_70;
  NActorIterator local_68;
  DAngle local_50;
  DVector3 local_48;
  
  if (thing != (AActor *)0x0) {
    if (thing->player == (player_t *)0x0) {
      bVar10 = 0;
    }
    else {
      bVar10 = (*(byte *)((long)&thing->player->cheats + 1) & 0x20) >> 5;
    }
    uVar11 = 0;
    if (((thing->flags2).Value & 0x80) != 0 || side != 0) goto LAB_0054999f;
    if (((byte)ib_compatflags & 8) == 0) {
      uVar11 = (ulong)(uint)tag;
    }
    iVar5 = (int)uVar11;
    if (tid == 0) {
      if (iVar5 == 0) {
LAB_00549733:
        unaff_R14 = (AActor *)0x0;
      }
      else {
        local_68.super_FActorIterator.base =
             (AActor *)CONCAT44(tagManager.TagHashFirst[uVar11 & 0xff],iVar5);
        do {
          uVar4 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
          if ((int)uVar4 < 0) break;
          local_98._0_4_ = 0x77;
          pPVar8 = PClass::FindClass((FName *)local_98);
          FThinkerIterator::FThinkerIterator((FThinkerIterator *)local_98,pPVar8,0x80);
          do {
            pAVar7 = (AActor *)FThinkerIterator::Next((FThinkerIterator *)local_98);
            pAVar6 = unaff_R14;
            if (pAVar7 == (AActor *)0x0) break;
            pAVar6 = pAVar7;
          } while (pAVar7->Sector != sectors + uVar4);
          unaff_R14 = pAVar6;
        } while (pAVar7 == (AActor *)0x0);
        if ((int)uVar4 < 0) goto LAB_00549733;
      }
    }
    else {
      local_98._0_8_ = (AActor *)0x0;
      local_68.super_FActorIterator.base =
           (AActor *)CONCAT44(local_68.super_FActorIterator.base._4_4_,0x77);
      local_98._8_4_ = tid;
      local_98._16_8_ = PClass::FindClass((FName *)&local_68);
      pAVar6 = NActorIterator::Next((NActorIterator *)local_98);
      iVar12 = 0;
      if (pAVar6 != (AActor *)0x0) {
        do {
          if ((iVar5 == 0) ||
             (bVar3 = FTagManager::SectorHasTag(&tagManager,pAVar6->Sector,iVar5), bVar3)) {
            iVar12 = iVar12 + 1;
          }
          pAVar6 = NActorIterator::Next((NActorIterator *)local_98);
        } while (pAVar6 != (AActor *)0x0);
      }
      if (iVar12 == 1) {
LAB_005496d0:
        if (0 < iVar12) {
          do {
            unaff_R14 = NActorIterator::Next((NActorIterator *)local_98);
            if ((iVar5 == 0) ||
               (bVar3 = FTagManager::SectorHasTag(&tagManager,unaff_R14->Sector,iVar5), bVar3)) {
              iVar12 = iVar12 + -1;
            }
          } while (0 < iVar12);
          goto LAB_00549736;
        }
      }
      else {
        if (iVar12 != 0) {
          if (bVar10 == 0) {
            uVar4 = FRandom::GenRand32(&pr_teleport);
            iVar12 = (int)((long)(ulong)(uVar4 & 0xff) % (long)iVar12) + 1;
          }
          goto LAB_005496d0;
        }
        if (iVar5 == 0) {
          local_68.super_FActorIterator.base = (AActor *)0x0;
          local_7c.Index = 0x104;
          local_68.super_FActorIterator.id = tid;
          local_68.type = PClass::FindClass(&local_7c);
          unaff_R14 = NActorIterator::Next(&local_68);
          if (unaff_R14 == (AActor *)0x0) {
            for (unaff_R14 = AActor::TIDHash[tid & 0x7f];
                (unaff_R14 != (AActor *)0x0 && (unaff_R14->tid != tid));
                unaff_R14 = unaff_R14->inext) {
            }
            do {
              if ((unaff_R14 == (AActor *)0x0) || (((unaff_R14->flags).Value & 2) == 0)) break;
              do {
                unaff_R14 = unaff_R14->inext;
                if (unaff_R14 == (AActor *)0x0) break;
              } while (unaff_R14->tid != tid);
            } while( true );
          }
          goto LAB_00549736;
        }
      }
      unaff_R14 = (AActor *)0x0;
    }
LAB_00549736:
    if (unaff_R14 != (AActor *)0x0) {
      if (line == (line_t *)0x0 || (flags & 0x60U) == 0) {
        local_98._0_4_ = 0x78;
        pPVar8 = PClass::FindClass((FName *)local_98);
        if ((unaff_R14->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar5 = (**(unaff_R14->super_DThinker).super_DObject._vptr_DObject)(unaff_R14);
          (unaff_R14->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
        }
        pPVar9 = (unaff_R14->super_DThinker).super_DObject.Class;
        bVar3 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar8 && bVar3) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar3 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar8) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        local_78 = 0.0;
        uStack_70 = 0;
        if (bVar3) {
          local_b0 = 0.0;
          local_b8 = 0.0;
          dVar13 = 0.0;
          uVar15 = 0;
          uVar16 = 0;
          goto LAB_0054985b;
        }
        local_48.Z = -2147483648.0;
        local_b0 = 0.0;
        local_b8 = 0.0;
        dVar13 = 0.0;
        uVar15 = 0;
        uVar16 = 0;
      }
      else {
        dVar13 = c_atan2((line->delta).Y,(line->delta).X);
        local_78 = (dVar13 * 57.29577951308232 - (unaff_R14->Angles).Yaw.Degrees) + 90.0;
        uStack_70 = extraout_XMM0_Qb;
        if ((flags & 0x40U) != 0) {
          local_78 = -local_78;
          uStack_70 = extraout_XMM0_Qb ^ 0x8000000000000000;
        }
        local_b0 = FFastTrig::sin(&fasttrig,local_78);
        local_b8 = FFastTrig::cos(&fasttrig,local_b0);
        dVar13 = (thing->Vel).X;
        dVar1 = (thing->Vel).Y;
        uVar15 = SUB84(dVar1,0);
        uVar16 = (undefined4)((ulong)dVar1 >> 0x20);
LAB_0054985b:
        local_48.Z = (unaff_R14->__Pos).Z;
      }
      dVar14 = 0.0;
      dVar1 = (double)CONCAT44(uVar16,uVar15);
      if ((((byte)i_compatflags2 & 1) != 0) && (thing->player != (player_t *)0x0)) {
        dVar14 = 0.01;
      }
      local_48.X = (unaff_R14->__Pos).X;
      local_48.Y = (unaff_R14->__Pos).Y;
      local_50.Degrees = dVar14 + (unaff_R14->Angles).Yaw.Degrees;
      bVar3 = P_Teleport(thing,&local_48,&local_50,flags);
      if (bVar3) {
        if ((flags & 0x60U) != 0 && line != (line_t *)0x0) {
          (thing->Angles).Yaw.Degrees = local_78 + (thing->Angles).Yaw.Degrees;
          (thing->Vel).X = local_b8 * dVar13 - local_b0 * dVar1;
          (thing->Vel).Y = local_b0 * dVar13 + local_b8 * dVar1;
        }
        uVar11 = 1;
        if ((((dVar13 == 0.0) && (!NAN(dVar13))) && (dVar1 == 0.0)) &&
           (((!NAN(dVar1) && (thing->player != (player_t *)0x0)) &&
            (pAVar2 = thing->player->mo, pAVar2 == (APlayerPawn *)thing && bVar10 == 0)))) {
          (*(pAVar2->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])();
        }
        goto LAB_0054999f;
      }
    }
  }
  uVar11 = 0;
LAB_0054999f:
  return SUB81(uVar11,0);
}

Assistant:

bool EV_Teleport (int tid, int tag, line_t *line, int side, AActor *thing, int flags)
{
	AActor *searcher;
	double z;
	DAngle angle = 0.;
	double s = 0, c = 0;
	double vx = 0, vy = 0;
	DAngle badangle = 0.;

	if (thing == NULL)
	{ // Teleport function called with an invalid actor
		return false;
	}
	bool predicting = (thing->player && (thing->player->cheats & CF_PREDICTING));
	if (thing->flags2 & MF2_NOTELEPORT)
	{
		return false;
	}
	if (side != 0)
	{ // Don't teleport if hit back of line, so you can get out of teleporter.
		return 0;
	}
	searcher = SelectTeleDest(tid, tag, predicting);
	if (searcher == NULL)
	{
		return false;
	}
	// [RH] Lee Killough's changes for silent teleporters from BOOM
	if ((flags & (TELF_ROTATEBOOM|TELF_ROTATEBOOMINVERSE)) && line)
	{
		// Get the angle between the exit thing and source linedef.
		// Rotate 90 degrees, so that walking perpendicularly across
		// teleporter linedef causes thing to exit in the direction
		// indicated by the exit thing.
		angle = line->Delta().Angle() - searcher->Angles.Yaw + 90.;
		if (flags & TELF_ROTATEBOOMINVERSE) angle = -angle;

		// Sine, cosine of angle adjustment
		s = angle.Sin();
		c = angle.Cos();

		// Velocity of thing crossing teleporter linedef
		vx = thing->Vel.X;
		vy = thing->Vel.Y;

		z = searcher->Z();
	}
	else if (searcher->IsKindOf (PClass::FindClass(NAME_TeleportDest2)))
	{
		z = searcher->Z();
	}
	else
	{
		z = ONFLOORZ;
	}
	if ((i_compatflags2 & COMPATF2_BADANGLES) && (thing->player != NULL))
	{
		badangle = 0.01;
	}
	if (P_Teleport (thing, DVector3(searcher->Pos(), z), searcher->Angles.Yaw + badangle, flags))
	{
		// [RH] Lee Killough's changes for silent teleporters from BOOM
		if (line)
		{
			if (flags & (TELF_ROTATEBOOM| TELF_ROTATEBOOMINVERSE))
			{
				// Rotate thing according to difference in angles (or not - Boom got the direction wrong here.)
				thing->Angles.Yaw += angle;

				// Rotate thing's velocity to come out of exit just like it entered
				thing->Vel.X = vx*c - vy*s;
				thing->Vel.Y = vy*c + vx*s;
			}
		}
		if (vx == 0 && vy == 0 && thing->player != NULL && thing->player->mo == thing && !predicting)
		{
			thing->player->mo->PlayIdle ();
		}
		return true;
	}
	return false;
}